

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

QObject ** __thiscall
QHash<QObject_*,_QString>::keyImpl(QHash<QObject_*,_QString> *this,QString *value)

{
  byte bVar1;
  char16_t *pcVar2;
  QObject *pQVar3;
  Span *pSVar4;
  QObject *pQVar5;
  ulong uVar6;
  bool bVar7;
  Data *pDVar8;
  ulong uVar9;
  Entry *unaff_R15;
  bool bVar10;
  QStringView rhs;
  QStringView lhs;
  
  pDVar8 = this->d;
  if (pDVar8 != (Data *)0x0) {
    if (pDVar8->spans->offsets[0] == 0xff) {
      uVar6 = 1;
      do {
        uVar9 = uVar6;
        if (pDVar8->numBuckets == uVar9) {
          pDVar8 = (Data *)0x0;
          uVar9 = 0;
          break;
        }
        uVar6 = uVar9 + 1;
      } while (pDVar8->spans[uVar9 >> 7].offsets[(uint)uVar9 & 0x7f] == 0xff);
    }
    else {
      uVar9 = 0;
    }
    bVar10 = uVar9 == 0 && pDVar8 == (Data *)0x0;
    if (uVar9 != 0 || pDVar8 != (Data *)0x0) {
      pcVar2 = (value->d).ptr;
      pQVar3 = (QObject *)(value->d).size;
      do {
        pSVar4 = pDVar8->spans;
        unaff_R15 = pSVar4[uVar9 >> 7].entries;
        bVar1 = pSVar4[uVar9 >> 7].offsets[(uint)uVar9 & 0x7f];
        pQVar5 = *(QObject **)(unaff_R15[bVar1].storage.data + 0x18);
        if ((pQVar5 == pQVar3) &&
           (rhs.m_data = pcVar2, rhs.m_size = (qsizetype)pQVar3,
           lhs.m_data = (storage_type_conflict *)*(QObject **)(unaff_R15[bVar1].storage.data + 0x10)
           , lhs.m_size = (qsizetype)pQVar5, bVar7 = QtPrivate::equalStrings(lhs,rhs), bVar7)) {
          unaff_R15 = unaff_R15 + bVar1;
          break;
        }
        do {
          if (pDVar8->numBuckets - 1 == uVar9) {
            uVar9 = 0;
            pDVar8 = (Data *)0x0;
            break;
          }
          uVar9 = uVar9 + 1;
        } while (pSVar4[uVar9 >> 7].offsets[(uint)uVar9 & 0x7f] == 0xff);
        bVar10 = uVar9 == 0 && pDVar8 == (Data *)0x0;
      } while (uVar9 != 0 || pDVar8 != (Data *)0x0);
    }
    if (!bVar10) {
      return (QObject **)unaff_R15;
    }
  }
  return (QObject **)0x0;
}

Assistant:

const Key *keyImpl(const T &value) const noexcept
    {
        if (d) {
            const_iterator i = begin();
            while (i != end()) {
                if (i.value() == value)
                    return &i.key();
                ++i;
            }
        }

        return nullptr;
    }